

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O3

double SimpleBVH::anon_unknown_6::point_box_signed_squared_distance
                 (VectorMax3d *p,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *B)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar1 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows;
  if (lVar1 != B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_rows) {
    __assert_fail("p.size() == B[0].size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0x9f,
                  "double SimpleBVH::(anonymous namespace)::point_box_signed_squared_distance(const VectorMax3d &, const std::array<VectorMax3d, 2> &)"
                 );
  }
  if (lVar1 < 1) {
LAB_001199c3:
    __assert_fail("index >= 0 && index < size()",
                  "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0xa3,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>, Level = 0]"
                 );
  }
  bVar5 = true;
  dVar6 = 0.0;
  lVar3 = 0;
  do {
    if (lVar1 == lVar3) goto LAB_001199c3;
    dVar7 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
            array[lVar3];
    dVar8 = B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
            m_data.array[lVar3];
    if (dVar7 < dVar8) {
LAB_0011990a:
      dVar6 = dVar6 + (dVar7 - dVar8) * (dVar7 - dVar8);
      bVar5 = false;
    }
    else {
      if (B->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
          m_rows <= lVar3) goto LAB_001199c3;
      dVar8 = B->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
              .m_data.array[lVar3];
      if (dVar8 < dVar7) goto LAB_0011990a;
    }
    lVar3 = lVar3 + 1;
  } while (lVar1 != lVar3);
  if (bVar5) {
    lVar3 = B->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
            m_rows;
    if (lVar3 < 1) goto LAB_001199c3;
    dVar7 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
            array[0];
    dVar6 = dVar7 - B->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[0];
    dVar7 = dVar7 - B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[0];
    dVar6 = dVar6 * dVar6;
    dVar7 = dVar7 * dVar7;
    if (dVar7 <= dVar6) {
      dVar6 = dVar7;
    }
    if (lVar1 != 1) {
      uVar4 = lVar3 - 1;
      uVar2 = lVar1 - 2U;
      if (uVar4 < lVar1 - 2U) {
        uVar2 = uVar4;
      }
      if ((lVar1 - 1U <= uVar2) || (uVar4 == uVar2)) goto LAB_001199c3;
      uVar2 = 0;
      do {
        dVar7 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
                array[uVar2 + 1];
        dVar8 = dVar7 - B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                        .m_storage.m_data.array[uVar2 + 1];
        dVar8 = dVar8 * dVar8;
        if (dVar6 <= dVar8) {
          dVar8 = dVar6;
        }
        dVar7 = dVar7 - B->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                        .m_storage.m_data.array[uVar2 + 1];
        dVar6 = dVar7 * dVar7;
        if (dVar8 <= dVar6) {
          dVar6 = dVar8;
        }
        uVar2 = uVar2 + 1;
      } while (lVar1 - 1U != uVar2);
    }
    dVar6 = -dVar6;
  }
  return dVar6;
}

Assistant:

double point_box_signed_squared_distance(
        const VectorMax3d& p, const std::array<VectorMax3d, 2>& B)
    {
        assert(p.size() == B[0].size());

        bool inside = true;
        double result = 0.0;
        for (int c = 0; c < p.size(); c++) {
            if (p[c] < B[0][c]) {
                inside = false;
                result += std::pow(p[c] - B[0][c], 2);
            } else if (p[c] > B[1][c]) {
                inside = false;
                result += std::pow(p[c] - B[1][c], 2);
            }
        }
        if (inside) {
            result = -inner_point_box_squared_distance(p, B);
        }
        return result;
    }